

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

void lodepng_decoder_settings_init(LodePNGDecoderSettings *settings)

{
  settings->read_text_chunks = 1;
  settings->remember_unknown_chunks = 0;
  settings->max_text_size = 0x1000000;
  settings->max_icc_size = 0x1000000;
  settings->ignore_end = 0;
  settings->color_convert = 1;
  (settings->zlibsettings).ignore_adler32 = 0;
  (settings->zlibsettings).ignore_nlen = 0;
  (settings->zlibsettings).max_output_size = 0;
  (settings->zlibsettings).custom_zlib =
       (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGDecompressSettings_ptr *)0x0;
  (settings->zlibsettings).custom_inflate =
       (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGDecompressSettings_ptr *)0x0;
  (settings->zlibsettings).custom_context = (void *)0x0;
  settings->ignore_crc = 0;
  settings->ignore_critical = 0;
  return;
}

Assistant:

void lodepng_decoder_settings_init(LodePNGDecoderSettings* settings) {
  settings->color_convert = 1;
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
  settings->read_text_chunks = 1;
  settings->remember_unknown_chunks = 0;
  settings->max_text_size = 16777216;
  settings->max_icc_size = 16777216; /* 16MB is much more than enough for any reasonable ICC profile */
#endif /*LODEPNG_COMPILE_ANCILLARY_CHUNKS*/
  settings->ignore_crc = 0;
  settings->ignore_critical = 0;
  settings->ignore_end = 0;
  lodepng_decompress_settings_init(&settings->zlibsettings);
}